

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  Headers *this_00;
  char cVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  Response *pRVar4;
  Stream *strm_00;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  HandlerResponse HVar8;
  int iVar9;
  ostream *poVar10;
  _Alloc_hider _Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  const_iterator cVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ssize_t sVar15;
  _Base_ptr p_Var16;
  long lVar17;
  int extraout_var;
  int extraout_var_00;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar22;
  string boundary;
  string content_type;
  stringstream ss;
  key_type local_278;
  Request *local_258;
  Server *local_250;
  _Base_ptr local_248;
  undefined **local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  Response *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  Stream *local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_190;
  ios_base local_138 [264];
  
  local_258 = req;
  local_200 = strm;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                  ,0x155d,
                  "bool httplib::Server::write_response_core(Stream &, bool, const Request &, Response &, bool)"
                 );
  }
  if ((res->status < 400) ||
     ((this->error_handler_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_230 = &local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_238 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)local_238;
    local_1d8._M_dataplus._M_p = (pointer)local_230;
    if (need_apply_ranges) goto LAB_0014dcb0;
  }
  else {
    HVar8 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    local_230 = &local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_238 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)local_238;
    local_1d8._M_dataplus._M_p = (pointer)local_230;
    if (HVar8 == Handled || need_apply_ranges) {
LAB_0014dcb0:
      local_230 = &local_1d8.field_2;
      local_238 = &local_1f8.field_2;
      local_1d8.field_2._M_local_buf[0] = '\0';
      local_1d8._M_string_length = 0;
      local_1f8.field_2._M_local_buf[0] = '\0';
      local_1f8._M_string_length = 0;
      local_1f8._M_dataplus._M_p = (pointer)local_238;
      local_1d8._M_dataplus._M_p = (pointer)local_230;
      apply_ranges(this,local_258,res,&local_1d8,&local_1f8);
    }
  }
  local_250 = this;
  if (close_connection) {
LAB_0014dec1:
    local_1b8._0_8_ =
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Connection","");
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"close","");
    cVar1 = *(char *)local_1b8._0_8_;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._0_8_;
    while (cVar1 != '\0') {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar12->_M_local_buf + 1);
      if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014df66;
      cVar1 = paVar12->_M_local_buf[0];
    }
    cVar1 = *local_278._M_dataplus._M_p;
    _Var11._M_p = local_278._M_dataplus._M_p;
    while (cVar1 != '\0') {
      _Var11._M_p = _Var11._M_p + 1;
      if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014df66;
      cVar1 = *_Var11._M_p;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
               &local_278);
LAB_0014df66:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->field_2)
    {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  else {
    paVar12 = &local_278.field_2;
    local_278._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Connection","");
    pVar22 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&(local_258->headers)._M_t,&local_278);
    if (pVar22.first._M_node._M_node == pVar22.second._M_node._M_node) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)(pVar22.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_1b8,pcVar18,(allocator *)&local_220);
    iVar9 = std::__cxx11::string::compare((char *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->field_2)
    {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar12) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (iVar9 == 0) goto LAB_0014dec1;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->
                field_2,"timeout=",8);
    poVar10 = std::ostream::_M_insert<long>
                        ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b8)->field_2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", max=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    local_278._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Keep-Alive","");
    std::__cxx11::stringbuf::str();
    cVar1 = *local_278._M_dataplus._M_p;
    _Var11._M_p = local_278._M_dataplus._M_p;
    while (cVar1 != '\0') {
      _Var11._M_p = _Var11._M_p + 1;
      if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014de6a;
      cVar1 = *_Var11._M_p;
    }
    cVar1 = *local_220._M_dataplus._M_p;
    _Var11._M_p = local_220._M_dataplus._M_p;
    while (cVar1 != '\0') {
      _Var11._M_p = _Var11._M_p + 1;
      if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014de6a;
      cVar1 = *_Var11._M_p;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,&local_278,&local_220);
LAB_0014de6a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar12) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar12 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->
             field_2;
  local_1b8._0_8_ = paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Type","");
  this_00 = &res->headers;
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1b8);
  local_248 = &(res->headers)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (cVar13._M_node == local_248) {
    if (res->content_length_ != 0 || (res->body)._M_string_length != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != paVar12) {
        operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
      }
LAB_0014e046:
      local_1b8._0_8_ = paVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Type","");
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"text/plain","");
      cVar1 = *(char *)local_1b8._0_8_;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_;
      while (cVar1 != '\0') {
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar14->_M_local_buf + 1);
        if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014e0e0;
        cVar1 = paVar14->_M_local_buf[0];
      }
      cVar1 = *local_278._M_dataplus._M_p;
      _Var11._M_p = local_278._M_dataplus._M_p;
      while (cVar1 != '\0') {
        _Var11._M_p = _Var11._M_p + 1;
        if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014e0e0;
        cVar1 = *_Var11._M_p;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_278);
LAB_0014e0e0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014e0f6;
    }
    p_Var2 = (res->content_provider_).super__Function_base._M_manager;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar12) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if (p_Var2 != (_Manager_type)0x0) goto LAB_0014e046;
  }
  else {
LAB_0014e0f6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar12) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  local_1b8._0_8_ = paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Length","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1b8);
  if ((cVar13._M_node == local_248) &&
     (res->content_length_ == 0 && (res->body)._M_string_length == 0)) {
    p_Var2 = (res->content_provider_).super__Function_base._M_manager;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar12) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if (p_Var2 == (_Manager_type)0x0) {
      local_1b8._0_8_ = paVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Length","");
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"0","");
      cVar1 = *(char *)local_1b8._0_8_;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_;
      while (cVar1 != '\0') {
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar14->_M_local_buf + 1);
        if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014e22a;
        cVar1 = paVar14->_M_local_buf[0];
      }
      cVar1 = *local_278._M_dataplus._M_p;
      _Var11._M_p = local_278._M_dataplus._M_p;
      while (cVar1 != '\0') {
        _Var11._M_p = _Var11._M_p + 1;
        if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014e22a;
        cVar1 = *_Var11._M_p;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_278);
LAB_0014e22a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014e240;
    }
  }
  else {
LAB_0014e240:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar12) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  local_1b8._0_8_ = paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Accept-Ranges","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1b8);
  if (cVar13._M_node == local_248) {
    iVar9 = std::__cxx11::string::compare((char *)local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar12) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if (iVar9 == 0) {
      local_1b8._0_8_ = paVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Accept-Ranges","");
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"bytes","");
      cVar1 = *(char *)local_1b8._0_8_;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_;
      while (cVar1 != '\0') {
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar14->_M_local_buf + 1);
        if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014e5a8;
        cVar1 = paVar14->_M_local_buf[0];
      }
      cVar1 = *local_278._M_dataplus._M_p;
      _Var11._M_p = local_278._M_dataplus._M_p;
      while (cVar1 != '\0') {
        _Var11._M_p = _Var11._M_p + 1;
        if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_0014e5a8;
        cVar1 = *_Var11._M_p;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_278);
LAB_0014e5a8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014e292;
    }
  }
  else {
LAB_0014e292:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar12) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  if ((local_250->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_250->post_routing_handler_)._M_invoker)
              ((_Any_data *)&local_250->post_routing_handler_,local_258,res);
  }
  local_1b8._8_8_ =
       (long)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->
             field_2)._M_local_buf + 8;
  local_240 = &PTR__BufferStream_00186578;
  local_1b8._0_8_ = &PTR__BufferStream_00186578;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._M_local_buf[8] = '\0';
  local_190 = 0;
  local_228 = res;
  local_278._M_dataplus._M_p = detail::status_message(res->status);
  sVar15 = Stream::write_format<int,char_const*>
                     ((Stream *)local_1b8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_278);
  if (sVar15 != 0) {
    p_Var16 = (local_228->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var16 == local_248) {
      lVar19 = 0;
    }
    else {
      lVar19 = 0;
      do {
        local_278._M_dataplus._M_p = *(pointer *)(p_Var16 + 1);
        local_220._M_dataplus._M_p = *(pointer *)(p_Var16 + 2);
        sVar15 = Stream::write_format<char_const*,char_const*>
                           ((Stream *)local_1b8,"%s: %s\r\n",(char **)&local_278,(char **)&local_220
                           );
        if (sVar15 < 0) goto LAB_0014e408;
        lVar19 = lVar19 + sVar15;
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != local_248);
    }
    lVar17 = (**(code **)(local_1b8._0_8_ + 0x28))
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1b8,"\r\n",2);
    if (lVar17 < 0) {
      lVar19 = 0;
    }
    if (lVar19 != 0 || lVar17 != 0) {
LAB_0014e408:
      uVar6 = local_1a8._M_allocated_capacity;
      uVar5 = local_1b8._8_8_;
      strm_00 = local_200;
      uVar20 = 0;
      do {
        if ((ulong)uVar6 <= uVar20) break;
        iVar9 = (*strm_00->_vptr_Stream[5])(strm_00,(undefined1 *)(uVar5 + uVar20));
        uVar20 = uVar20 + CONCAT44(extraout_var,iVar9);
      } while (-1 < extraout_var);
      local_1b8._0_8_ = local_240;
      if ((undefined1 *)local_1b8._8_8_ !=
          (undefined1 *)
          ((long)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->
                 field_2)._M_local_buf + 8U)) {
        operator_delete((void *)local_1b8._8_8_,
                        CONCAT71(local_1a8._9_7_,local_1a8._M_local_buf[8]) + 1);
      }
      iVar9 = std::__cxx11::string::compare((char *)local_258);
      pRVar4 = local_228;
      bVar7 = true;
      if (iVar9 != 0) {
        uVar20 = (local_228->body)._M_string_length;
        if (uVar20 == 0) {
          if ((local_228->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)
          {
            bVar7 = write_content_with_provider
                              (local_250,strm_00,local_258,local_228,&local_1f8,&local_1d8);
            pRVar4->content_provider_success_ = bVar7;
          }
        }
        else {
          pcVar3 = (local_228->body)._M_dataplus._M_p;
          uVar21 = 0;
          do {
            bVar7 = uVar20 <= uVar21;
            if (uVar20 <= uVar21) break;
            iVar9 = (*strm_00->_vptr_Stream[5])(strm_00,pcVar3 + uVar21);
            uVar21 = uVar21 + CONCAT44(extraout_var_00,iVar9);
          } while (-1 < extraout_var_00);
        }
      }
      if ((local_250->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(local_250->logger_)._M_invoker)((_Any_data *)&local_250->logger_,local_258,pRVar4);
      }
      goto LAB_0014e625;
    }
  }
  local_1b8._0_8_ = local_240;
  if ((undefined1 *)local_1b8._8_8_ !=
      (undefined1 *)
      ((long)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)->
             field_2)._M_local_buf + 8U)) {
    operator_delete((void *)local_1b8._8_8_,CONCAT71(local_1a8._9_7_,local_1a8._M_local_buf[8]) + 1)
    ;
  }
  bVar7 = false;
LAB_0014e625:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != local_238) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != local_230) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            detail::status_message(res.status))) {
      return false;
    }

    if (!detail::write_headers(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}